

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

void __thiscall
t_javame_generator::generate_java_struct_reader
          (t_javame_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *tfield;
  t_struct *ptVar1;
  bool bVar2;
  int32_t iVar3;
  ostream *poVar4;
  reference pptVar5;
  string *psVar6;
  t_type *type;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  allocator local_131;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_b0;
  t_field **local_a8;
  string local_a0;
  string local_80;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_60;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_javame_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_40);
  poVar4 = std::operator<<(poVar4,"public void read(TProtocol iprot) throws TException {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  t_generator::indent_up((t_generator *)this);
  f_iter._M_current = (t_field **)t_struct::get_members(local_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_60);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_80,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_80);
  poVar4 = std::operator<<(poVar4,"TField field;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_a0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_a0);
  poVar4 = std::operator<<(poVar4,"iprot.readStructBegin();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"while (true)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)tstruct_local);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"field = iprot.readFieldBegin();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"if (field.type == TType.STOP) { ");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"break;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"switch (field.id) {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  local_a8 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_60._M_current = local_a8;
  while( true ) {
    local_b0._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_60,&local_b0);
    if (!bVar2) break;
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar4 = std::operator<<(poVar4,"case ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    iVar3 = t_field::get_key(*pptVar5);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,": // ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::string((string *)&local_f0,(string *)psVar6);
    constant_name(&local_d0,this,&local_f0);
    poVar4 = std::operator<<(poVar4,(string *)&local_d0);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    t_generator::indent_up((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar4 = std::operator<<(poVar4,"if (field.type == ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    type = t_field::get_type(*pptVar5);
    type_to_enum_abi_cxx11_(&local_110,this,type);
    poVar4 = std::operator<<(poVar4,(string *)&local_110);
    poVar4 = std::operator<<(poVar4,") {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_110);
    t_generator::indent_up((t_generator *)this);
    ptVar1 = tstruct_local;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    tfield = *pptVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_130,"this.",&local_131);
    generate_deserialize_field(this,(ostream *)ptVar1,tfield,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    ptVar1 = tstruct_local;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    generate_isset_set(this,(ostream *)ptVar1,*pptVar5);
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_158);
    poVar4 = std::operator<<(poVar4,"} else { ");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_178);
    poVar4 = std::operator<<(poVar4,"  TProtocolUtil.skip(iprot, field.type);");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_198);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_1b8);
    poVar4 = std::operator<<(poVar4,"break;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_158);
    t_generator::indent_down((t_generator *)this);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_60);
  }
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"default:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"  TProtocolUtil.skip(iprot, field.type);");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"iprot.readFieldEnd();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_1d8,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_1d8);
  poVar4 = std::operator<<(poVar4,"iprot.readStructEnd();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1d8);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"validate();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_1f8);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1f8);
  return;
}

Assistant:

void t_javame_generator::generate_java_struct_reader(ostream& out, t_struct* tstruct) {
  out << indent() << "public void read(TProtocol iprot) throws TException {" << endl;
  indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  // Declare stack tmp variables and read struct header
  out << indent() << "TField field;" << endl << indent() << "iprot.readStructBegin();" << endl;

  // Loop over reading in fields
  indent(out) << "while (true)" << endl;
  scope_up(out);

  // Read beginning field marker
  indent(out) << "field = iprot.readFieldBegin();" << endl;

  // Check for field STOP marker and break
  indent(out) << "if (field.type == TType.STOP) { " << endl;
  indent_up();
  indent(out) << "break;" << endl;
  indent_down();
  indent(out) << "}" << endl;

  // Switch statement on the field we are reading
  indent(out) << "switch (field.id) {" << endl;

  indent_up();

  // Generate deserialization code for known cases
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    indent(out) << "case " << (*f_iter)->get_key() << ": // "
                << constant_name((*f_iter)->get_name()) << endl;
    indent_up();
    indent(out) << "if (field.type == " << type_to_enum((*f_iter)->get_type()) << ") {" << endl;
    indent_up();

    generate_deserialize_field(out, *f_iter, "this.");
    generate_isset_set(out, *f_iter);
    indent_down();
    out << indent() << "} else { " << endl << indent() << "  TProtocolUtil.skip(iprot, field.type);"
        << endl << indent() << "}" << endl << indent() << "break;" << endl;
    indent_down();
  }

  indent(out) << "default:" << endl;
  indent(out) << "  TProtocolUtil.skip(iprot, field.type);" << endl;

  indent_down();
  indent(out) << "}" << endl;

  // Read field end marker
  indent(out) << "iprot.readFieldEnd();" << endl;

  indent_down();
  indent(out) << "}" << endl;

  out << indent() << "iprot.readStructEnd();" << endl;

  // performs various checks (e.g. check that all required fields are set)
  indent(out) << "validate();" << endl;

  indent_down();
  out << indent() << "}" << endl << endl;
}